

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sample_output.cc
# Opt level: O3

void sample_output<trng::mt19937>(mt19937 *r,string *name)

{
  ulong uVar1;
  int iVar2;
  undefined8 in_RAX;
  long lVar3;
  ostream *poVar4;
  uint uVar5;
  int i;
  int iVar7;
  undefined8 uStack_38;
  uint uVar6;
  
  uVar1 = name->_M_string_length;
  uStack_38 = in_RAX;
  while (uVar1 < 0x20) {
    std::__cxx11::string::push_back((char)name);
    uVar1 = name->_M_string_length;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(name->_M_dataplus)._M_p,uVar1);
  iVar7 = 0;
  do {
    iVar2 = (r->S).mti;
    if (0x26f < iVar2) {
      uVar6 = (r->S).mt[0];
      lVar3 = 0;
      do {
        uVar5 = uVar6 & 0x80000000;
        uVar6 = (r->S).mt[lVar3 + 1];
        (r->S).mt[lVar3] =
             *(uint *)(&DAT_00108178 + (ulong)(uVar6 & 1) * 4) ^ (r->S).mt[lVar3 + 0x18d] ^
             (uVar6 & 0x7ffffffe | uVar5) >> 1;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0xe3);
      uVar6 = (r->S).mt[0xe3];
      lVar3 = 0;
      do {
        uVar5 = uVar6 & 0x80000000;
        uVar6 = (r->S).mt[lVar3 + 0xe4];
        (r->S).mt[lVar3 + 0xe3] =
             *(uint *)(&DAT_00108178 + (ulong)(uVar6 & 1) * 4) ^ (r->S).mt[lVar3] ^
             (uVar6 & 0x7ffffffe | uVar5) >> 1;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x18c);
      uVar6 = (r->S).mt[0];
      (r->S).mt[0x26f] =
           *(uint *)(&DAT_00108178 + (ulong)(uVar6 & 1) * 4) ^ (r->S).mt[0x18c] ^
           (uVar6 & 0x7ffffffe | (r->S).mt[0x26f] & 0x80000000) >> 1;
      iVar2 = 0;
    }
    (r->S).mti = iVar2 + 1;
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    uStack_38._0_7_ = CONCAT16(9,(undefined6)uStack_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)((long)&uStack_38 + 6),1);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 0xf);
  iVar7 = (r->S).mti;
  if (0x26f < iVar7) {
    uVar6 = (r->S).mt[0];
    lVar3 = 0;
    do {
      uVar5 = uVar6 & 0x80000000;
      uVar6 = (r->S).mt[lVar3 + 1];
      (r->S).mt[lVar3] =
           *(uint *)(&DAT_00108178 + (ulong)(uVar6 & 1) * 4) ^ (r->S).mt[lVar3 + 0x18d] ^
           (uVar6 & 0x7ffffffe | uVar5) >> 1;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0xe3);
    uVar6 = (r->S).mt[0xe3];
    lVar3 = 0;
    do {
      uVar5 = uVar6 & 0x80000000;
      uVar6 = (r->S).mt[lVar3 + 0xe4];
      (r->S).mt[lVar3 + 0xe3] =
           *(uint *)(&DAT_00108178 + (ulong)(uVar6 & 1) * 4) ^ (r->S).mt[lVar3] ^
           (uVar6 & 0x7ffffffe | uVar5) >> 1;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x18c);
    uVar6 = (r->S).mt[0];
    (r->S).mt[0x26f] =
         *(uint *)(&DAT_00108178 + (ulong)(uVar6 & 1) * 4) ^ (r->S).mt[0x18c] ^
         (uVar6 & 0x7ffffffe | (r->S).mt[0x26f] & 0x80000000) >> 1;
    iVar7 = 0;
  }
  (r->S).mti = iVar7 + 1;
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  uStack_38 = CONCAT17(10,(undefined7)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)((long)&uStack_38 + 7),1);
  return;
}

Assistant:

void sample_output(R &r, std::string name) {
  while (name.length() < 32)
    name += ' ';
  std::cout << name;
  for (int i{0}; i < 15; ++i)
    std::cout << r() << '\t';
  std::cout << r() << '\n';
}